

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O3

bool __thiscall
Win32MakefileGenerator::processPrlFileBase
          (Win32MakefileGenerator *this,QString *origFile,QStringView origName,QStringView fixedBase
          ,int slashOff)

{
  storage_type_conflict sVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  QStringView fixedBase_00;
  
  fixedBase_00.m_data = fixedBase.m_data;
  uVar8 = fixedBase.m_size;
  bVar2 = MakefileGenerator::processPrlFileBase
                    (&this->super_MakefileGenerator,origFile,origName,fixedBase,slashOff);
  uVar7 = (ulong)bVar2;
  bVar4 = true;
  if (!(bool)bVar2) {
    if (slashOff < (int)fixedBase.m_size) {
      lVar6 = uVar8 << 0x20;
      lVar9 = (long)(int)fixedBase.m_size;
      do {
        bVar2 = (byte)uVar7;
        sVar1 = fixedBase_00.m_data[lVar9 + -1];
        if (9 < (ushort)sVar1 - 0x30) {
          if (0x7f < (ushort)sVar1) {
            iVar5 = QChar::category((uint)(ushort)sVar1);
            bVar2 = (byte)uVar7;
            if (iVar5 == 3) goto LAB_00255ecf;
          }
          uVar7 = lVar6 >> 0x20;
          if (uVar7 != uVar8) {
            if (uVar8 < uVar7) {
              uVar7 = uVar8;
            }
            fixedBase_00.m_size = uVar7;
            bVar2 = MakefileGenerator::processPrlFileBase
                              (&this->super_MakefileGenerator,origFile,origName,fixedBase_00,
                               slashOff);
            bVar3 = 1;
            goto LAB_00255ee7;
          }
          break;
        }
LAB_00255ecf:
        bVar2 = (byte)uVar7;
        lVar9 = lVar9 + -1;
        lVar6 = lVar6 + -0x100000000;
      } while (slashOff < lVar9);
    }
    bVar3 = 0;
LAB_00255ee7:
    bVar4 = (bool)(bVar3 & bVar2);
  }
  return bVar4;
}

Assistant:

bool Win32MakefileGenerator::processPrlFileBase(QString &origFile, QStringView origName,
                                                QStringView fixedBase, int slashOff)
{
    if (MakefileGenerator::processPrlFileBase(origFile, origName, fixedBase, slashOff))
        return true;
    for (int off = fixedBase.size(); off > slashOff; off--) {
        if (!fixedBase.at(off - 1).isDigit()) {
            if (off != fixedBase.size()) {
                return MakefileGenerator::processPrlFileBase(
                            origFile, origName, fixedBase.left(off), slashOff);
            }
            break;
        }
    }
    return false;
}